

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

void __thiscall ON_RevSurface::ON_RevSurface(ON_RevSurface *this)

{
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint local_30;
  
  ON_Surface::ON_Surface(&this->super_ON_Surface);
  (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_008192f8;
  this->m_curve = (ON_Curve *)0x0;
  dVar3 = ON_3dPoint::Origin.z;
  dVar2 = ON_3dPoint::Origin.y;
  dVar1 = ON_3dPoint::Origin.x;
  ON_3dPoint::ON_3dPoint(&local_30,&ON_3dVector::ZAxis);
  from_pt.y = dVar2;
  from_pt.x = dVar1;
  from_pt.z = dVar3;
  to_pt.y = local_30.y;
  to_pt.x = local_30.x;
  to_pt.z = local_30.z;
  ON_Line::ON_Line(&this->m_axis,from_pt,to_pt);
  ON_Interval::ON_Interval(&this->m_angle,0.0,6.283185307179586);
  ON_Interval::ON_Interval(&this->m_t,0.0,6.283185307179586);
  this->m_bTransposed = false;
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  if (m_s_ON_RevSurface_ptr != (void *)0x0) {
    (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
         (_func_int **)m_s_ON_RevSurface_ptr;
  }
  return;
}

Assistant:

ON_RevSurface::ON_RevSurface() : m_curve(0), 
                                 m_axis( ON_3dPoint::Origin, ON_3dVector::ZAxis ), 
                                 m_angle( 0.0, 2.0*ON_PI ),
                                 m_t( 0.0, 2.0*ON_PI ),
                                 m_bTransposed(0)
{
  ON__SET__THIS__PTR(m_s_ON_RevSurface_ptr);
}